

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O2

basic_executor_type<std::allocator<void>,_4UL> * __thiscall
asio::execution::detail::any_executor_base::
target<asio::io_context::basic_executor_type<std::allocator<void>,4ul>>(any_executor_base *this)

{
  bool bVar1;
  type_info *this_00;
  basic_executor_type<std::allocator<void>,_4UL> *pbVar2;
  
  if (this->target_ != (void *)0x0) {
    this_00 = (*this->target_fns_->target_type)();
    bVar1 = CLI::std::type_info::operator==
                      ((type_info *)this_00,
                       (type_info *)
                       &asio::io_context::basic_executor_type<std::allocator<void>,4ul>::typeinfo);
    if (bVar1) {
      pbVar2 = (basic_executor_type<std::allocator<void>,_4UL> *)this->target_;
    }
    else {
      pbVar2 = (basic_executor_type<std::allocator<void>,_4UL> *)0x0;
    }
    return pbVar2;
  }
  return (basic_executor_type<std::allocator<void>,_4UL> *)0x0;
}

Assistant:

const Executor* target() const
  {
    return target_ && (is_same<Executor, void>::value
        || target_fns_->target_type() == target_type_ex<Executor>())
      ? static_cast<const Executor*>(target_) : 0;
  }